

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O2

ssize_t send(int __fd,void *__buf,size_t __n,int __flags)

{
  rpchook_t *prVar1;
  long lVar2;
  __time_t _Var3;
  bool bVar4;
  size_t sVar5;
  int *piVar6;
  ulong uVar7;
  pollfd local_38;
  
  if (g_sys_send_func == (send_pfn_t)0x0) {
    g_sys_send_func = (send_pfn_t)dlsym(0xffffffffffffffff,"send");
  }
  bVar4 = co_is_enable_sys_hook();
  if ((((!bVar4) || (999999 < (uint)__fd)) ||
      (prVar1 = g_rpchook_socket_fd[(uint)__fd], prVar1 == (rpchook_t *)0x0)) ||
     ((prVar1->user_flag & 0x800) != 0)) {
    sVar5 = (*g_sys_send_func)(__fd,__buf,__n,__flags);
    return sVar5;
  }
  _Var3 = (prVar1->write_timeout).tv_sec;
  lVar2 = (prVar1->write_timeout).tv_usec;
  sVar5 = (*g_sys_send_func)(__fd,__buf,__n,__flags);
  if ((long)sVar5 < 0) {
    piVar6 = __errno_location();
    if (*piVar6 != 0xb) {
      return sVar5;
    }
    sVar5 = 0;
  }
  uVar7 = sVar5;
  do {
    if (__n < uVar7 || __n - uVar7 == 0) {
LAB_001054c6:
      if (0 < (long)sVar5) {
        sVar5 = uVar7;
      }
      if (uVar7 == 0) {
        uVar7 = sVar5;
      }
      return uVar7;
    }
    local_38.events = 0x1c;
    local_38.revents = 0;
    local_38.fd = __fd;
    poll(&local_38,1,(int)(lVar2 / 1000) + (int)_Var3 * 1000);
    sVar5 = (*g_sys_send_func)(__fd,(void *)((long)__buf + uVar7),__n - uVar7,__flags);
    if ((long)sVar5 < 1) {
      piVar6 = __errno_location();
      if (*piVar6 == 0xb) {
        *piVar6 = 0x7c5;
      }
      goto LAB_001054c6;
    }
    uVar7 = uVar7 + sVar5;
  } while( true );
}

Assistant:

ssize_t send(int socket, const void *buffer, size_t length, int flags)
{
	HOOK_SYS_FUNC( send );
	
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_send_func( socket,buffer,length,flags );
	}
	rpchook_t *lp = get_by_fd( socket );

	if( !lp || ( O_NONBLOCK & lp->user_flag ) )
	{
		return g_sys_send_func( socket,buffer,length,flags );
	}
	size_t wrotelen = 0;
	int timeout = ( lp->write_timeout.tv_sec * 1000 ) 
				+ ( lp->write_timeout.tv_usec / 1000 );

	ssize_t writeret = g_sys_send_func( socket,buffer,length,flags );
	if(writeret <0 && (errno == EAGAIN || errno == EWOULDBLOCK )){
			//shouldn't usually happen, underlying device might be busy
			writeret = 0;
	}

	if(writeret<0){
		return writeret;
	}
	wrotelen+=writeret;

	while( wrotelen < length ){

		struct pollfd pf = { 0 };
		pf.fd = socket;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );
		poll( &pf,1,timeout );

		writeret = g_sys_send_func( socket,(const char*)buffer + wrotelen,length - wrotelen,flags );

		if( writeret <= 0 )
		{
			if( errno == EAGAIN  || errno == EWOULDBLOCK ){
				//poll timed out , the socket is still unwritable
				errno = LIBCO_POLL_TIMEOUT;
			}
			break;
		}
		wrotelen += writeret ;
	}
	if (writeret <= 0 && wrotelen == 0)
	{
		return writeret;
	}
	return wrotelen;
}